

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::testDiskAttrValue<Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>>
               (Header *diskHeader,TypedAttribute<Imf_2_5::TimeCode> *testAttribute)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Attribute *pAVar3;
  long lVar4;
  InputExc *this;
  allocator<char> local_39;
  string local_38;
  
  iVar2 = (*(testAttribute->super_Attribute)._vptr_Attribute[2])(testAttribute);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(char *)CONCAT44(extraout_var,iVar2),&local_39);
  pAVar3 = Imf_2_5::Header::operator[](diskHeader,&local_38);
  lVar4 = __dynamic_cast(pAVar3,&Imf_2_5::Attribute::typeinfo,
                         &Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::typeinfo,0);
  if (lVar4 == 0) {
    __cxa_bad_cast();
  }
  bVar1 = Imf_2_5::TimeCode::operator!=((TimeCode *)(lVar4 + 8),&testAttribute->_value);
  if (!bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this,"incorrect value from disk");
  __cxa_throw(this,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
testDiskAttrValue (const Header & diskHeader, const T & testAttribute)
{
    const string & attrName = testAttribute.typeName();
    const T & diskAttr = dynamic_cast <const T &> (diskHeader[attrName]);
    if (diskAttr.value() != testAttribute.value())
    {
        throw IEX_NAMESPACE::InputExc ("incorrect value from disk");
    }

    return;
}